

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_helper.hpp
# Opt level: O2

void duckdb::ExtensionHelper::TryAutoloadFromEntry<16ul>
               (DatabaseInstance *db,string *entry,ExtensionEntry (*entries) [16])

{
  bool bVar1;
  DBConfig *pDVar2;
  ExtensionEntry (*in_RCX) [16];
  string extension_name;
  string local_40;
  
  pDVar2 = DBConfig::GetConfig(db);
  if ((pDVar2->options).autoload_known_extensions == true) {
    FindExtensionInEntries<16ul>(&local_40,(ExtensionHelper *)entry,(string *)entries,in_RCX);
    bVar1 = CanAutoloadExtension(&local_40);
    if (bVar1) {
      AutoLoadExtension(db,&local_40);
    }
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

static void TryAutoloadFromEntry(DatabaseInstance &db, const string &entry, const ExtensionEntry (&entries)[N]) {
		auto &dbconfig = DBConfig::GetConfig(db);
#ifndef DUCKDB_DISABLE_EXTENSION_LOAD
		if (dbconfig.options.autoload_known_extensions) {
			auto extension_name = ExtensionHelper::FindExtensionInEntries(entry, entries);
			if (ExtensionHelper::CanAutoloadExtension(extension_name)) {
				ExtensionHelper::AutoLoadExtension(db, extension_name);
			}
		}
#endif
	}